

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O3

translator_type * __thiscall
cs::translator_type::add_method
          (translator_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *grammar
          ,method_base *method)

{
  size_t *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _List_node_base *p_Var3;
  undefined1 local_29;
  pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*> *local_28
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  method_base *local_10;
  
  local_28 = (pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>
              *)0x0;
  local_10 = method;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>,std::allocator<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,cs::method_base*&>
            (a_Stack_20,&local_28,
             (allocator<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>
              *)&local_29,grammar,&local_10);
  p_Var3 = (_List_node_base *)operator_new(0x20);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3[1]._M_next = (_List_node_base *)local_28;
  p_Var3[1]._M_prev = (_List_node_base *)_Var2._M_pi;
  local_28 = (pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>
              *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->m_data).
            super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return this;
}

Assistant:

translator_type &add_method(const std::deque<token_base *> &grammar, method_base *method)
		{
			m_data.emplace_back(std::make_shared<data_type>(grammar, method));
			return *this;
		}